

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

bool AM_clearMarks(void)

{
  int i;
  uint uVar1;
  
  for (uVar1 = 9; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    markpoints[uVar1].x = -1.0;
  }
  markpointnum = 0;
  return 0 < marknums[0].texnum;
}

Assistant:

bool AM_clearMarks ()
{
	for (int i = AM_NUMMARKPOINTS-1; i >= 0; i--)
		markpoints[i].x = -1; // means empty
	markpointnum = 0;
	return marknums[0].isValid();
}